

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.h
# Opt level: O0

void __thiscall gvr::Model::translate(Model *this,Vector3d *v)

{
  Matrix33d *T;
  SVector<double,_3> *in_RSI;
  Model *in_RDI;
  Matrix33d *in_stack_ffffffffffffffd8;
  Model *in_stack_ffffffffffffffe0;
  SVector<double,_3> *in_stack_ffffffffffffffe8;
  
  gmath::SVector<double,_3>::operator+=(&in_RDI->origin,in_RSI);
  T = getDefCameraR(in_RDI);
  getDefCameraT(in_RDI);
  gmath::SVector<double,_3>::operator+
            (in_stack_ffffffffffffffe8,(SVector<double,_3> *)in_stack_ffffffffffffffe0);
  setDefCameraRT(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(Vector3d *)T);
  return;
}

Assistant:

virtual void translate(const gmath::Vector3d &v)
    {
      origin+=v;
      setDefCameraRT(getDefCameraR(), getDefCameraT()+v);
    }